

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow.cpp
# Opt level: O3

void duckdb::ArrowTableFunction::RegisterFunction(BuiltinFunctions *set)

{
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  __alloc_node_gen_t __alloc_node_gen_1;
  TableFunction arrow_dumb;
  TableFunction arrow;
  allocator_type local_7c9;
  string local_7c8;
  vector<duckdb::LogicalType,_true> local_7a8;
  vector<duckdb::LogicalType,_true> local_790;
  string local_778;
  LogicalType local_758 [3];
  undefined1 local_710 [48];
  LogicalType local_6e0 [4];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  _Stack_680;
  undefined1 auStack_648 [80];
  code *local_5f8;
  code *local_5c8;
  undefined2 local_577;
  bool local_575;
  element_type *local_570;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_568;
  TableFunctionInitialization local_560;
  undefined1 local_558 [144];
  __buckets_ptr local_4c8;
  size_type local_4c0;
  __node_base local_4b8;
  size_type local_4b0;
  _Prime_rehash_policy local_4a8;
  __node_base_ptr local_498;
  undefined1 auStack_490 [216];
  element_type *local_3b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3b0;
  TableFunctionInitialization local_3a8;
  undefined1 local_3a0 [144];
  __buckets_ptr local_310;
  size_type local_308;
  __node_base local_300;
  size_type local_2f8;
  _Prime_rehash_policy local_2f0;
  __node_base_ptr local_2e0;
  undefined1 auStack_2d8 [216];
  element_type *local_200;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1f8;
  TableFunctionInitialization local_1f0;
  TableFunction local_1e8;
  
  local_778._M_dataplus._M_p = (pointer)&local_778.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_778,"arrow_scan","");
  LogicalType::LogicalType((LogicalType *)local_710,POINTER);
  LogicalType::LogicalType((LogicalType *)(local_710 + 0x18),POINTER);
  LogicalType::LogicalType(local_6e0,POINTER);
  __l._M_len = 3;
  __l._M_array = (iterator)local_710;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_790,__l,
             (allocator_type *)local_758);
  TableFunction::TableFunction
            (&local_1e8,&local_778,&local_790,ArrowScanFunction,ArrowScanBind,ArrowScanInitGlobal,
             ArrowScanInitLocal);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_790);
  lVar1 = 0x30;
  do {
    LogicalType::~LogicalType((LogicalType *)(local_710 + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_778._M_dataplus._M_p != &local_778.field_2) {
    operator_delete(local_778._M_dataplus._M_p);
  }
  local_1e8.cardinality = ArrowScanCardinality;
  local_1e8.get_partition_data = ArrowGetPartitionData;
  local_1e8.projection_pushdown = true;
  local_1e8.filter_pushdown = true;
  local_1e8.filter_prune = true;
  local_1e8.supports_pushdown_type = ArrowPushdownType;
  SimpleFunction::SimpleFunction((SimpleFunction *)local_3a0,(SimpleFunction *)&local_1e8);
  local_3a0._0_8_ = &PTR__SimpleNamedParameterFunction_01963d08;
  local_710._0_8_ = &local_310;
  local_310 = (__buckets_ptr)0x0;
  local_308 = local_1e8.super_SimpleNamedParameterFunction.named_parameters._M_h._M_bucket_count;
  local_300._M_nxt = (_Hash_node_base *)0x0;
  local_2f8 = local_1e8.super_SimpleNamedParameterFunction.named_parameters._M_h._M_element_count;
  local_2f0._M_max_load_factor =
       local_1e8.super_SimpleNamedParameterFunction.named_parameters._M_h._M_rehash_policy.
       _M_max_load_factor;
  local_2f0._4_4_ =
       local_1e8.super_SimpleNamedParameterFunction.named_parameters._M_h._M_rehash_policy._4_4_;
  local_2f0._M_next_resize =
       local_1e8.super_SimpleNamedParameterFunction.named_parameters._M_h._M_rehash_policy.
       _M_next_resize;
  local_2e0 = (__node_base_ptr)0x0;
  ::std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,duckdb::LogicalType>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_710._0_8_,&local_1e8.super_SimpleNamedParameterFunction.named_parameters._M_h,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>_>_>
              *)local_710);
  local_3a0._0_8_ = &PTR__TableFunction_01963be0;
  switchD_00b041bd::default(auStack_2d8,&local_1e8.bind,0xd6);
  local_200 = local_1e8.function_info.internal.
              super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1f8._M_pi =
       local_1e8.function_info.internal.
       super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_1e8.function_info.internal.
      super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1e8.function_info.internal.
       super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_1e8.function_info.internal.
            super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1e8.function_info.internal.
       super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_1e8.function_info.internal.
            super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  local_1f0 = local_1e8.global_initialization;
  BuiltinFunctions::AddFunction(set,(TableFunction *)local_3a0);
  local_3a0._0_8_ = &PTR__TableFunction_01963be0;
  if (local_1f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1f8._M_pi);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            ((SimpleNamedParameterFunction *)local_3a0);
  local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_7c8,"arrow_scan_dumb","");
  LogicalType::LogicalType(local_758,POINTER);
  LogicalType::LogicalType(local_758 + 1,POINTER);
  LogicalType::LogicalType(local_758 + 2,POINTER);
  __l_00._M_len = 3;
  __l_00._M_array = local_758;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_7a8,__l_00,
             &local_7c9);
  TableFunction::TableFunction
            ((TableFunction *)local_710,&local_7c8,&local_7a8,ArrowScanFunction,ArrowScanBindDumb,
             ArrowScanInitGlobal,ArrowScanInitLocal);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_7a8);
  lVar1 = 0x30;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_758[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
    operator_delete(local_7c8._M_dataplus._M_p);
  }
  local_5f8 = ArrowScanCardinality;
  local_5c8 = ArrowGetPartitionData;
  local_577._0_1_ = false;
  local_577._1_1_ = false;
  local_575 = false;
  SimpleFunction::SimpleFunction((SimpleFunction *)local_558,(SimpleFunction *)local_710);
  local_558._0_8_ = &PTR__SimpleNamedParameterFunction_01963d08;
  local_758[0]._0_8_ = &local_4c8;
  local_4c8 = (__buckets_ptr)0x0;
  local_4c0 = _Stack_680._M_bucket_count;
  local_4b8._M_nxt = (_Hash_node_base *)0x0;
  local_4b0 = _Stack_680._M_element_count;
  local_4a8._M_max_load_factor = _Stack_680._M_rehash_policy._M_max_load_factor;
  local_4a8._4_4_ = _Stack_680._M_rehash_policy._4_4_;
  local_4a8._M_next_resize = _Stack_680._M_rehash_policy._M_next_resize;
  local_498 = (__node_base_ptr)0x0;
  ::std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,duckdb::LogicalType>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_758[0]._0_8_,&_Stack_680,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>_>_>
              *)local_758);
  local_558._0_8_ = &PTR__TableFunction_01963be0;
  switchD_00b041bd::default(auStack_490,auStack_648,0xd6);
  local_3b8 = local_570;
  local_3b0._M_pi = local_568._M_pi;
  if (local_568._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_568._M_pi)->_M_use_count = (local_568._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_568._M_pi)->_M_use_count = (local_568._M_pi)->_M_use_count + 1;
    }
  }
  local_3a8 = local_560;
  BuiltinFunctions::AddFunction(set,(TableFunction *)local_558);
  local_558._0_8_ = &PTR__TableFunction_01963be0;
  if (local_3b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3b0._M_pi);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            ((SimpleNamedParameterFunction *)local_558);
  local_710._0_8_ = &PTR__TableFunction_01963be0;
  if (local_568._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_568._M_pi);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            ((SimpleNamedParameterFunction *)local_710);
  local_1e8.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__TableFunction_01963be0;
  if (local_1e8.function_info.internal.
      super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1e8.function_info.internal.
               super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            (&local_1e8.super_SimpleNamedParameterFunction);
  return;
}

Assistant:

void ArrowTableFunction::RegisterFunction(BuiltinFunctions &set) {
	TableFunction arrow("arrow_scan", {LogicalType::POINTER, LogicalType::POINTER, LogicalType::POINTER},
	                    ArrowScanFunction, ArrowScanBind, ArrowScanInitGlobal, ArrowScanInitLocal);
	arrow.cardinality = ArrowScanCardinality;
	arrow.get_partition_data = ArrowGetPartitionData;
	arrow.projection_pushdown = true;
	arrow.filter_pushdown = true;
	arrow.filter_prune = true;
	arrow.supports_pushdown_type = ArrowPushdownType;
	set.AddFunction(arrow);

	TableFunction arrow_dumb("arrow_scan_dumb", {LogicalType::POINTER, LogicalType::POINTER, LogicalType::POINTER},
	                         ArrowScanFunction, ArrowScanBindDumb, ArrowScanInitGlobal, ArrowScanInitLocal);
	arrow_dumb.cardinality = ArrowScanCardinality;
	arrow_dumb.get_partition_data = ArrowGetPartitionData;
	arrow_dumb.projection_pushdown = false;
	arrow_dumb.filter_pushdown = false;
	arrow_dumb.filter_prune = false;
	set.AddFunction(arrow_dumb);
}